

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar4;
  undefined7 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 in_register_0000003c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  text *name;
  text local_108;
  text local_e8;
  text local_c8;
  text local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  text local_50;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    name = &local_a8;
    std::__cxx11::string::string((string *)name,__str);
    bVar2 = hidden(name);
    uVar4 = (uint)CONCAT71(extraout_var,bVar2);
LAB_00108815:
    uVar4 = uVar4 ^ 1;
    std::__cxx11::string::~string((string *)name);
  }
  else {
    bVar2 = false;
    __return_storage_ptr__ = __str;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __readfds->fds_bits[1];
    do {
      do {
        __lhs = pbVar1 + -1;
        if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __readfds->fds_bits[0]) {
          if (bVar2) {
            name = &local_108;
            std::__cxx11::string::string((string *)name,__str);
            bVar2 = hidden(name);
            uVar4 = (uint)CONCAT71(extraout_var_00,bVar2);
            goto LAB_00108815;
          }
          goto LAB_0010884b;
        }
        bVar2 = std::operator==(__lhs,"@");
        uVar5 = (undefined7)((ulong)__return_storage_ptr__ >> 8);
        if ((bVar2) || (bVar2 = std::operator==(__lhs,"*"), bVar2)) {
          return (int)CONCAT71(uVar5,1);
        }
        std::__cxx11::string::string((string *)&local_50,__lhs);
        std::__cxx11::string::string((string *)&local_c8,__str);
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT71(uVar5,1);
        bVar2 = search(&local_50,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar2) {
          return (int)__return_storage_ptr__;
        }
        bVar2 = *(__lhs->_M_dataplus)._M_p == '!';
        pbVar1 = __lhs;
      } while (!bVar2);
      __return_storage_ptr__ = &local_70;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (__return_storage_ptr__,__lhs,1,0xffffffffffffffff);
      std::__cxx11::string::string((string *)&local_e8,__str);
      bVar3 = search(__return_storage_ptr__,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    } while (!bVar3);
LAB_0010884b:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}